

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O3

int read_partial_array(coda_cursor *cursor,long offset,long length,void *dst)

{
  ushort *puVar1;
  ulong uVar2;
  undefined4 uVar3;
  coda_dynamic_type_struct *pcVar4;
  coda_product_struct *pcVar5;
  coda_type *pcVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  int iVar27;
  int iVar28;
  long lVar29;
  char *pcVar30;
  char *pcVar31;
  char *pcVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  
  pcVar4 = cursor->stack[(long)cursor->n + -1].type;
  pcVar5 = cursor->product;
  pcVar6 = pcVar4[1].definition;
  lVar36 = *(long *)(*(long *)&pcVar6->type_class + 0x20) >> 3;
  if ((int)pcVar6->bit_size == 0) {
    iVar28 = read_bytes((coda_product *)pcVar5[1].filename,
                        (int64_t)(pcVar6->description + offset * lVar36),length * lVar36,dst);
    iVar27 = -1;
    if (iVar28 == 0) {
LAB_0014c904:
      lVar36 = *(long *)(*(long *)&(pcVar4[1].definition)->type_class + 0x20);
      iVar27 = 0;
      switch(lVar36 << 0x3d | lVar36 - 8U >> 3) {
      case 0:
        break;
      case 1:
        lVar35._0_4_ = pcVar4->definition[1].type_class;
        lVar35._4_4_ = pcVar4->definition[1].read_type;
        iVar27 = 0;
        if (0 < lVar35) {
          iVar27 = 0;
          lVar36 = 0;
          do {
            puVar1 = (ushort *)((long)dst + lVar36 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar36 = lVar36 + 1;
            lVar39._0_4_ = pcVar4->definition[1].type_class;
            lVar39._4_4_ = pcVar4->definition[1].read_type;
          } while (lVar36 < lVar39);
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-cursor.c"
                      ,0x15b,"int read_partial_array(const coda_cursor *, long, long, void *)");
      case 3:
        lVar37._0_4_ = pcVar4->definition[1].type_class;
        lVar37._4_4_ = pcVar4->definition[1].read_type;
        iVar27 = 0;
        if (0 < lVar37) {
          iVar27 = 0;
          lVar36 = 0;
          do {
            uVar3 = *(undefined4 *)((long)dst + lVar36 * 4);
            auVar40._8_8_ = 0;
            auVar40._0_8_ =
                 (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)((uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                                 CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                       0x10),(short)uVar3) & 0xffff00ff00ff00ff;
            auVar41 = pshuflw(auVar40,auVar40,0x1b);
            sVar7 = auVar41._0_2_;
            sVar8 = auVar41._2_2_;
            sVar9 = auVar41._4_2_;
            sVar10 = auVar41._6_2_;
            *(uint *)((long)dst + lVar36 * 4) =
                 CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar41[6] - (0xff < sVar10),
                          CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar41[4] - (0xff < sVar9),
                                   CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar41[2] -
                                            (0xff < sVar8),
                                            (0 < sVar7) * (sVar7 < 0x100) * auVar41[0] -
                                            (0xff < sVar7))));
            lVar36 = lVar36 + 1;
            lVar33._0_4_ = pcVar4->definition[1].type_class;
            lVar33._4_4_ = pcVar4->definition[1].read_type;
          } while (lVar36 < lVar33);
        }
        break;
      case 7:
        lVar36._0_4_ = pcVar4->definition[1].type_class;
        lVar36._4_4_ = pcVar4->definition[1].read_type;
        iVar27 = 0;
        if (0 < lVar36) {
          lVar36 = 0;
          do {
            uVar2 = *(ulong *)((long)dst + lVar36 * 8);
            auVar15._8_6_ = 0;
            auVar15._0_8_ = uVar2;
            auVar15[0xe] = (char)(uVar2 >> 0x38);
            auVar16._8_4_ = 0;
            auVar16._0_8_ = uVar2;
            auVar16[0xc] = (char)(uVar2 >> 0x30);
            auVar16._13_2_ = auVar15._13_2_;
            auVar17._8_4_ = 0;
            auVar17._0_8_ = uVar2;
            auVar17._12_3_ = auVar16._12_3_;
            auVar18._8_2_ = 0;
            auVar18._0_8_ = uVar2;
            auVar18[10] = (char)(uVar2 >> 0x28);
            auVar18._11_4_ = auVar17._11_4_;
            auVar19._8_2_ = 0;
            auVar19._0_8_ = uVar2;
            auVar19._10_5_ = auVar18._10_5_;
            auVar20[8] = (char)(uVar2 >> 0x20);
            auVar20._0_8_ = uVar2;
            auVar20._9_6_ = auVar19._9_6_;
            auVar41[7] = 0;
            auVar41._0_7_ = auVar20._8_7_;
            auVar23._7_8_ = 0;
            auVar23._0_7_ = auVar20._8_7_;
            auVar25._1_8_ = SUB158(auVar23 << 0x40,7);
            auVar25[0] = (char)(uVar2 >> 0x18);
            auVar25._9_6_ = 0;
            auVar24._1_10_ = SUB1510(auVar25 << 0x30,5);
            auVar24[0] = (char)(uVar2 >> 0x10);
            auVar26._11_4_ = 0;
            auVar26._0_11_ = auVar24;
            auVar21[2] = (char)(uVar2 >> 8);
            auVar21._0_2_ = (ushort)uVar2;
            auVar21._3_12_ = SUB1512(auVar26 << 0x20,3);
            auVar22._2_13_ = auVar21._2_13_;
            auVar22._0_2_ = (ushort)uVar2 & 0xff;
            auVar41._8_4_ = auVar22._0_4_;
            auVar41._12_4_ = auVar24._0_4_;
            auVar41 = pshuflw(auVar41,auVar41,0x1b);
            auVar41 = pshufhw(auVar41,auVar41,0x1b);
            sVar7 = auVar41._0_2_;
            sVar8 = auVar41._2_2_;
            sVar9 = auVar41._4_2_;
            sVar10 = auVar41._6_2_;
            sVar11 = auVar41._8_2_;
            sVar12 = auVar41._10_2_;
            sVar13 = auVar41._12_2_;
            sVar14 = auVar41._14_2_;
            *(ulong *)((long)dst + lVar36 * 8) =
                 CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar41[0xe] - (0xff < sVar14),
                          CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar41[0xc] - (0xff < sVar13),
                                   CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar41[10] -
                                            (0xff < sVar12),
                                            CONCAT14((0 < sVar11) * (sVar11 < 0x100) * auVar41[8] -
                                                     (0xff < sVar11),
                                                     CONCAT13((0 < sVar10) * (sVar10 < 0x100) *
                                                              auVar41[6] - (0xff < sVar10),
                                                              CONCAT12((0 < sVar9) * (sVar9 < 0x100)
                                                                       * auVar41[4] - (0xff < sVar9)
                                                                       ,CONCAT11((0 < sVar8) *
                                                                                 (sVar8 < 0x100) *
                                                                                 auVar41[2] -
                                                                                 (0xff < sVar8),
                                                                                 (0 < sVar7) *
                                                                                 (sVar7 < 0x100) *
                                                                                 auVar41[0] -
                                                                                 (0xff < sVar7))))))
                                  ));
            lVar36 = lVar36 + 1;
            lVar29._0_4_ = pcVar4->definition[1].type_class;
            lVar29._4_4_ = pcVar4->definition[1].read_type;
            iVar27 = 0;
          } while (lVar36 < lVar29);
        }
      }
    }
  }
  else {
    pcVar30 = pcVar4->definition[1].description;
    lVar29 = *(long *)&pcVar4->definition[1].type_class / (long)pcVar30;
    pcVar32 = (char *)0x0;
    if ((long)pcVar30 < 1) {
      pcVar30 = pcVar32;
    }
    lVar35 = lVar36 * offset;
    lVar39 = 0;
    lVar33 = 0;
    pcVar31 = (char *)0x0;
    lVar37 = lVar29;
    do {
      lVar38 = length + offset;
      if (lVar37 < length + offset) {
        lVar38 = lVar37;
      }
      if (pcVar30 == pcVar31) goto LAB_0014c904;
      lVar34 = 0;
      if (lVar39 < offset) {
        lVar34 = lVar35;
      }
      lVar38 = (long)(pcVar32 + lVar38) * lVar36 - lVar34;
      iVar27 = read_bytes((coda_product *)pcVar5[1].filename,
                          (int64_t)((pcVar4[1].definition)->description +
                                   (long)pcVar31 * *(long *)&pcVar5[1].format + lVar34),lVar38,
                          (void *)((long)dst + lVar33));
      lVar33 = lVar33 + lVar38;
      lVar39 = lVar39 + lVar29;
      lVar35 = lVar35 - lVar36 * lVar29;
      lVar37 = lVar37 + lVar29;
      pcVar32 = pcVar32 + -lVar29;
      pcVar31 = pcVar31 + 1;
    } while (iVar27 == 0);
    iVar27 = -1;
  }
  return iVar27;
}

Assistant:

static int read_partial_array(const coda_cursor *cursor, long offset, long length, void *dst)
{
    coda_netcdf_array *type;
    coda_netcdf_product *product;
    long value_size;
    long i;

    type = (coda_netcdf_array *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;

    value_size = (long)(type->base_type->definition->bit_size >> 3);
    if (type->base_type->record_var)
    {
        long num_blocks = type->definition->dim[0];
        long num_values_per_block;
        int64_t target_offset;

        num_values_per_block = type->definition->num_elements / num_blocks;
        target_offset = 0;

        for (i = 0; i < num_blocks; i++)
        {
            int64_t local_offset = 0;   /* byte offset within record */
            int64_t local_size = num_values_per_block * value_size;     /* amount of bytes to read */

            if (offset + length < (i + 1) * num_values_per_block)
            {
                local_size = (offset + length - i * num_values_per_block) * value_size;
            }
            if (offset > i * num_values_per_block)
            {
                local_offset = (offset - i * num_values_per_block) * value_size;
                local_size -= local_offset;
            }
            if (read_bytes(product->raw_product, type->base_type->offset + i * product->record_size + local_offset,
                           local_size, &((uint8_t *)dst)[target_offset]) != 0)
            {
                return -1;
            }
            target_offset += local_size;
        }

    }
    else
    {
        if (read_bytes(product->raw_product, type->base_type->offset + offset * value_size, length * value_size,
                       (uint8_t *)dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    switch (type->base_type->definition->bit_size)
    {
        case 8:
            /* no endianness conversion needed */
            break;
        case 16:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap2(&((int16_t *)dst)[i]);
            }
            break;
        case 32:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap4(&((int32_t *)dst)[i]);
            }
            break;
        case 64:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap8(&((int64_t *)dst)[i]);
            }
            break;
        default:
            assert(0);
            exit(1);
    }
#endif

    return 0;
}